

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O3

void __thiscall
flatbuffers::BinaryAnnotator::BuildString
          (BinaryAnnotator *this,uint64_t string_offset,Object *table,Field *field)

{
  Object *pOVar1;
  bool bVar2;
  long *plVar3;
  Object *pOVar4;
  long *plVar5;
  size_type *psVar6;
  uint64_t uVar7;
  _Alloc_hider _Var8;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions;
  allocator<char> local_539;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_538;
  Object *local_518;
  Field *local_510;
  BinaryRegionStatus local_508;
  undefined1 *local_500;
  long local_4f8;
  undefined1 local_4f0;
  undefined7 uStack_4ef;
  BinaryRegionCommentType local_4e0;
  undefined1 *local_4d8;
  long local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  undefined1 *local_4b8;
  long local_4b0;
  undefined1 local_4a8;
  undefined7 uStack_4a7;
  size_t local_498;
  undefined1 local_490 [40];
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_468;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_450;
  _Alloc_hider local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined1 local_3f0 [40];
  BinaryRegionCommentType local_3c8;
  undefined1 *local_3c0;
  long local_3b8;
  undefined1 local_3b0;
  undefined7 uStack_3af;
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390;
  undefined7 uStack_38f;
  size_t local_380;
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  undefined8 local_338;
  ulong *local_330;
  long local_328;
  ulong auStack_320 [2];
  BinaryRegionCommentType local_310;
  undefined1 *local_308;
  long local_300;
  undefined1 local_2f8;
  undefined7 uStack_2f7;
  undefined1 *local_2e8;
  long local_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  size_t local_2c8;
  undefined1 local_2c0 [8];
  _Alloc_hider local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  BinaryRegionCommentType local_298;
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  _Alloc_hider local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  size_t local_250;
  long *local_248 [2];
  long local_238 [2];
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  BinaryRegionCommentType local_200;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  size_t local_1b8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  BinaryRegionCommentType local_188;
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  _Alloc_hider local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  size_t local_140;
  undefined1 local_138 [8];
  _Alloc_hider local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  BinaryRegionCommentType local_110;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  size_t local_c8;
  undefined1 local_c0 [8];
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  BinaryRegionCommentType local_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_50;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> local_48;
  
  bVar2 = ContainsSection(this,string_offset);
  if (bVar2) {
    return;
  }
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pOVar1 = (Object *)this->binary_length_;
  if (pOVar1 <= (Object *)(string_offset + 3) || pOVar1 < (Object *)0x5) {
    uVar7 = 0;
  }
  else {
    uVar7 = (uint64_t)*(uint *)(this->binary_ + string_offset);
  }
  local_508 = OK;
  local_500 = &local_4f0;
  local_4f8 = 0;
  local_4f0 = 0;
  local_4d8 = &local_4c8;
  local_4d0 = 0;
  local_4c8 = 0;
  local_4b8 = &local_4a8;
  local_4b0 = 0;
  local_4a8 = 0;
  local_498 = 0;
  local_4e0 = StringLength;
  if (pOVar1 <= (Object *)(string_offset + 3) || pOVar1 < (Object *)0x5) {
    uVar7 = 0;
    if (string_offset <= pOVar1) {
      uVar7 = (long)pOVar1 - string_offset;
    }
    local_510 = field;
    local_358[0] = local_348;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"4","");
    local_508 = ERROR_INCOMPLETE_BINARY;
    std::__cxx11::string::_M_assign((string *)&local_500);
    local_518 = table;
    if (local_358[0] != local_348) {
      operator_delete(local_358[0],local_348[0] + 1);
    }
    local_c0._0_4_ = local_508;
    local_b8._M_p = (pointer)&local_a8;
    std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_500,local_500 + local_4f8);
    local_98 = local_4e0;
    local_90._M_p = (pointer)&local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_4d8,local_4d8 + local_4d0);
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_4b8,local_4b8 + local_4b0);
    local_50 = local_498;
    anon_unknown_49::MakeBinaryRegion
              ((BinaryRegion *)local_490,string_offset,uVar7,Unknown,uVar7,0,
               (BinaryRegionComment *)local_c0);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
    emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_p != &local_428) {
      operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468.
           super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
           ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
      operator_delete(local_468.
                      super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                      ._M_impl.super__Vector_impl_data._M_finish,local_450._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_p != &local_80) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
    table = local_518;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      table = local_518;
    }
  }
  else {
    pOVar4 = (Object *)(uVar7 + string_offset + 4);
    if (pOVar4 < pOVar1) {
      local_2c0._0_4_ = OK;
      local_2b8._M_p = (pointer)&local_2a8;
      local_518 = pOVar4;
      std::__cxx11::string::_M_construct<char*>((string *)&local_2b8,local_500,local_500);
      local_298 = local_4e0;
      local_290._M_p = (pointer)&local_280;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,local_4d8,local_4d8 + local_4d0);
      local_270._M_p = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_4b8,local_4b8 + local_4b0);
      local_250 = local_498;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,string_offset,4,Uint32,0,0,
                 (BinaryRegionComment *)local_2c0);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_p != &local_260) {
        operator_delete(local_270._M_p,local_260._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_p != &local_280) {
        operator_delete(local_290._M_p,local_280._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_p != &local_2a8) {
        operator_delete(local_2b8._M_p,local_2a8._M_allocated_capacity + 1);
      }
      local_3f0._8_8_ = local_3f0 + 0x18;
      local_3f0._0_8_ = (ulong)(uint)local_3f0._4_4_ << 0x20;
      local_3f0._16_8_ = 0;
      local_3f0._24_8_ = local_3f0._24_8_ & 0xffffffffffffff00;
      local_3c0 = &local_3b0;
      local_3b8 = 0;
      local_3b0 = 0;
      local_3a0 = &local_390;
      local_398 = 0;
      local_390 = 0;
      local_380 = 0;
      local_3c8 = StringValue;
      local_138._0_4_ = OK;
      local_130._M_p = (pointer)&local_120;
      std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_3f0._8_8_);
      local_110 = local_3c8;
      local_108._M_p = (pointer)&local_f8;
      local_510 = field;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_3c0,local_3c0 + local_3b8);
      local_e8._M_p = (pointer)&local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,local_3a0,local_3a0 + local_398)
      ;
      local_c8 = local_380;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,string_offset + 4,uVar7,Char,uVar7,0,
                 (BinaryRegionComment *)local_138);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_p != &local_d8) {
        operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_p != &local_120) {
        operator_delete(local_130._M_p,local_120._M_allocated_capacity + 1);
      }
      local_330 = auStack_320;
      local_338 = (long *)((ulong)local_338._4_4_ << 0x20);
      local_328 = 0;
      auStack_320[0] = auStack_320[0] & 0xffffffffffffff00;
      local_308 = &local_2f8;
      local_300 = 0;
      local_2f8 = 0;
      local_2e0 = 0;
      local_2d8 = 0;
      local_2c8 = 0;
      local_310 = StringTerminator;
      local_228._0_4_ = OK;
      local_220._M_p = (pointer)&local_210;
      local_2e8 = &local_2d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_220,local_330);
      local_200 = local_310;
      local_1f8._M_p = (pointer)&local_1e8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,local_308,local_308 + local_300);
      local_1d8._M_p = (pointer)&local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,local_2e8,local_2e8 + local_2e0);
      local_1b8 = local_2c8;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,(uint64_t)local_518,1,Char,0,0,
                 (BinaryRegionComment *)local_228);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_p != &local_1c8) {
        operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_p != &local_1e8) {
        operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_p != &local_210) {
        operator_delete(local_220._M_p,local_210._M_allocated_capacity + 1);
      }
      if (local_2e8 != &local_2d8) {
        operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
      }
      if (local_330 != auStack_320) {
        operator_delete(local_330,auStack_320[0] + 1);
      }
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,CONCAT71(uStack_38f,local_390) + 1);
      }
      if (local_3c0 != &local_3b0) {
        operator_delete(local_3c0,CONCAT71(uStack_3af,local_3b0) + 1);
      }
      local_198._M_allocated_capacity = local_3f0._24_8_;
      _Var8._M_p = (pointer)local_3f0._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._8_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_3f0 + 0x18)) goto LAB_0030b031;
    }
    else {
      local_378[0] = local_368;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_378,"");
      local_508 = ERROR_LENGTH_TOO_LONG;
      std::__cxx11::string::_M_assign((string *)&local_500);
      if (local_378[0] != local_368) {
        operator_delete(local_378[0],local_368[0] + 1);
      }
      local_1b0._0_4_ = local_508;
      local_1a8._M_p = (pointer)&local_198;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1a8,local_500,local_500 + local_4f8);
      local_188 = local_4e0;
      local_180._M_p = (pointer)&local_170;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,local_4d8,local_4d8 + local_4d0);
      local_160._M_p = (pointer)&local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_160,local_4b8,local_4b8 + local_4b0);
      local_140 = local_498;
      anon_unknown_49::MakeBinaryRegion
                ((BinaryRegion *)local_490,string_offset,4,Uint32,0,0,
                 (BinaryRegionComment *)local_1b0);
      std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
      emplace_back<flatbuffers::BinaryRegion>(&local_538,(BinaryRegion *)local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p,local_408._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p,local_428._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.
             super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish != &local_450) {
        operator_delete(local_468.
                        super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                        local_450._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_p != &local_150) {
        operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_p != &local_170) {
        operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
      }
      _Var8._M_p = local_1a8._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_p == &local_198) goto LAB_0030b031;
    }
    operator_delete(_Var8._M_p,local_198._M_allocated_capacity + 1);
  }
LAB_0030b031:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,
             (char *)(table + (ulong)*(uint *)(table + *(ushort *)
                                                        (table + (4 - (long)*(int *)table))) +
                              (ulong)*(ushort *)(table + (4 - (long)*(int *)table)) + 4),&local_539)
  ;
  plVar3 = (long *)std::__cxx11::string::append((char *)local_248);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_328 = *plVar5;
    auStack_320[0] = plVar3[3];
    local_338 = &local_328;
  }
  else {
    local_328 = *plVar5;
    local_338 = (long *)*plVar3;
  }
  local_330 = (ulong *)plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_338);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    local_3f0._16_8_ = *psVar6;
    local_3f0._24_8_ = plVar3[3];
    local_3f0._0_8_ = local_3f0 + 0x10;
  }
  else {
    local_3f0._16_8_ = *psVar6;
    local_3f0._0_8_ = (size_type *)*plVar3;
  }
  local_3f0._8_8_ = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_538.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_538.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_538.
       super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  anon_unknown_49::MakeBinarySection
            ((BinarySection *)local_490,(string *)local_3f0,String,&local_48);
  AddSection(this,string_offset,(BinarySection *)local_490);
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_468);
  if ((undefined1 *)local_490._0_8_ != local_490 + 0x10) {
    operator_delete((void *)local_490._0_8_,local_490._16_8_ + 1);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_48);
  if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
    operator_delete((void *)local_3f0._0_8_,local_3f0._16_8_ + 1);
  }
  if (local_338 != &local_328) {
    operator_delete(local_338,local_328 + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,CONCAT71(uStack_4a7,local_4a8) + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
  }
  if (local_500 != &local_4f0) {
    operator_delete(local_500,CONCAT71(uStack_4ef,local_4f0) + 1);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            (&local_538);
  return;
}

Assistant:

void BinaryAnnotator::BuildString(const uint64_t string_offset,
                                  const reflection::Object *const table,
                                  const reflection::Field *const field) {
  // Check if we have already generated this string section, and this is a
  // shared string instance.
  if (ContainsSection(string_offset)) { return; }

  std::vector<BinaryRegion> regions;
  const auto string_length = ReadScalar<uint32_t>(string_offset);

  BinaryRegionComment string_length_comment;
  string_length_comment.type = BinaryRegionCommentType::StringLength;

  if (!string_length.has_value()) {
    const uint64_t remaining = RemainingBytes(string_offset);

    SetError(string_length_comment, BinaryRegionStatus::ERROR_INCOMPLETE_BINARY,
             "4");

    regions.push_back(MakeBinaryRegion(string_offset, remaining,
                                       BinaryRegionType::Unknown, remaining, 0,
                                       string_length_comment));

  } else {
    const uint32_t string_size = string_length.value();
    const uint64_t string_end =
        string_offset + sizeof(uint32_t) + string_size + sizeof(char);

    if (!IsValidOffset(string_end - 1)) {
      SetError(string_length_comment,
               BinaryRegionStatus::ERROR_LENGTH_TOO_LONG);

      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));
    } else {
      regions.push_back(MakeBinaryRegion(string_offset, sizeof(uint32_t),
                                         BinaryRegionType::Uint32, 0, 0,
                                         string_length_comment));

      BinaryRegionComment string_comment;
      string_comment.type = BinaryRegionCommentType::StringValue;

      regions.push_back(MakeBinaryRegion(string_offset + sizeof(uint32_t),
                                         string_size, BinaryRegionType::Char,
                                         string_size, 0, string_comment));

      BinaryRegionComment string_terminator_comment;
      string_terminator_comment.type =
          BinaryRegionCommentType::StringTerminator;

      regions.push_back(MakeBinaryRegion(
          string_offset + sizeof(uint32_t) + string_size, sizeof(char),
          BinaryRegionType::Char, 0, 0, string_terminator_comment));
    }
  }

  AddSection(string_offset,
             MakeBinarySection(std::string(table->name()->c_str()) + "." +
                                   field->name()->c_str(),
                               BinarySectionType::String, std::move(regions)));
}